

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIDisplayer.cpp
# Opt level: O3

void __thiscall UIDisplayer::drawGameplayScreen(UIDisplayer *this,World *world)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PrimitiveDisplayer *pPVar2;
  long lVar3;
  UIDisplayer *this_00;
  World *this_01;
  Colour *pCVar4;
  Vec2d *this_02;
  Tetromino *pTVar5;
  TetrominoType *this_03;
  int i;
  int iVar6;
  uint uVar7;
  Drawable *drawable;
  undefined1 local_260 [8];
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined8 auStack_240 [12];
  ios_base local_1e0 [112];
  char acStack_170 [152];
  Vec2d local_d8;
  Vec2d local_d0;
  Vec2d local_c8;
  Vec2d local_c0;
  Vec2d local_b8;
  Vec2d local_b0;
  Vec2d local_a8;
  Vec2d local_a0;
  Vec2d local_98;
  Vec2d local_90;
  Vec2d local_88;
  Vec2d local_80;
  Vec2d local_78;
  UIDisplayer *local_70;
  string local_68;
  World *local_48;
  Colour *local_40;
  float local_34;
  
  local_48 = world;
  pCVar4 = Palette::getColour(this->palette,8);
  iVar6 = 1;
  Palette::getColour(this->palette,1);
  Palette::getColour(this->palette,8);
  pPVar2 = this->primitiveDisplayer;
  local_70 = this;
  Vec2d::Vec2d(&local_d8,30.0,30.0);
  Vec2d::Vec2d(&local_d0,300.0,600.0);
  local_40 = pCVar4;
  PrimitiveDisplayer::drawRectangleOutline(pPVar2,local_d8,local_d0,pCVar4);
  glPushMatrix();
  glColor4f(0x3f800000,0x3f800000,0x3f800000,0x3f000000);
  glTranslatef(0x3f800000,0x3f800000,0);
  do {
    glPushMatrix();
    glTranslatef(0x41f00000,0,0);
    glLineWidth(*(undefined4 *)(&DAT_001251d0 + (ulong)(iVar6 == 5) * 4));
    glBegin(1);
    local_34 = (float)iVar6 * 30.0;
    glVertex2f();
    glVertex2f(local_34);
    glEnd();
    glPopMatrix();
    iVar6 = iVar6 + 1;
  } while (iVar6 != 10);
  uVar7 = 1;
  do {
    glPushMatrix();
    glTranslatef(0,0x41f00000,0);
    glLineWidth(*(undefined4 *)
                 (&DAT_001251d0 +
                 (ulong)((char)uVar7 == (char)((char)((uVar7 & 0xff) / 5) * '\x05')) * 4));
    glBegin(1);
    local_34 = (float)(int)uVar7 * 30.0;
    glVertex2f();
    glVertex2f(0x43a50000,local_34);
    glEnd();
    glPopMatrix();
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x14);
  glPopMatrix();
  this_00 = local_70;
  pPVar2 = local_70->primitiveDisplayer;
  Vec2d::Vec2d(&local_c8,360.0,30.0);
  Vec2d::Vec2d(&local_c0,270.0,120.0);
  PrimitiveDisplayer::drawRectangleOutline(pPVar2,local_c8,local_c0,local_40);
  Vec2d::Vec2d(&local_a8,372.0,44.0);
  local_260 = (undefined1  [8])&local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"NEXT","");
  pCVar4 = Palette::getColour(this_00->palette,2);
  drawParagraphAtCoords(this_00,local_a8,(string *)local_260,4.0,pCVar4,false);
  if (local_260 != (undefined1  [8])&local_250) {
    operator_delete((void *)local_260);
  }
  glPushMatrix();
  this_02 = (Vec2d *)operator_new(8);
  Vec2d::Vec2d(this_02,0.0,20.0);
  glTranslatef(0x43ff0000,0x43070000,0);
  this_01 = local_48;
  pPVar2 = this_00->primitiveDisplayer;
  pTVar5 = World::getNextTet(local_48);
  drawable = &pTVar5->super_Drawable;
  if (pTVar5 == (Tetromino *)0x0) {
    drawable = (Drawable *)0x0;
  }
  pTVar5 = World::getNextTet(this_01);
  this_03 = Tetromino::getType(pTVar5);
  iVar6 = TetrominoType::getDisplayRotation(this_03);
  PrimitiveDisplayer::drawableWithGLRotation(pPVar2,drawable,(float)iVar6,this_02);
  operator_delete(this_02);
  glPopMatrix();
  pPVar2 = this_00->primitiveDisplayer;
  Vec2d::Vec2d(&local_b8,360.0,180.0);
  Vec2d::Vec2d(&local_b0,270.0,120.0);
  PrimitiveDisplayer::drawRectangleOutline(pPVar2,local_b8,local_b0,local_40);
  Vec2d::Vec2d(&local_a0,372.0,194.0);
  local_260 = (undefined1  [8])&local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"SCORE","");
  pCVar4 = Palette::getColour(this_00->palette,2);
  drawParagraphAtCoords(this_00,local_a0,(string *)local_260,4.0,pCVar4,false);
  if (local_260 != (undefined1  [8])&local_250) {
    operator_delete((void *)local_260);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_260);
  *(undefined8 *)((long)auStack_240 + *(long *)(local_250._M_allocated_capacity - 0x18)) = 6;
  lVar3 = *(long *)(local_250._M_allocated_capacity - 0x18);
  if (acStack_170[lVar3 + 1] == '\0') {
    std::ios::widen((char)&local_250 + (char)lVar3);
    acStack_170[lVar3 + 1] = '\x01';
  }
  acStack_170[lVar3] = '0';
  iVar6 = World::getScore(local_48);
  std::ostream::operator<<((ostream *)local_250._M_local_buf,iVar6);
  Vec2d::Vec2d(&local_98,372.0,236.0);
  std::__cxx11::stringbuf::str();
  pCVar4 = Palette::getColour(this_00->palette,0);
  drawParagraphAtCoords(this_00,local_98,&local_68,7.0,pCVar4,true);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pPVar2 = this_00->primitiveDisplayer;
  Vec2d::Vec2d(&local_90,360.0,510.0);
  Vec2d::Vec2d(&local_88,270.0,120.0);
  PrimitiveDisplayer::drawRectangleOutline(pPVar2,local_90,local_88,local_40);
  Vec2d::Vec2d(&local_80,448.0,524.0);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"LANA","");
  pCVar4 = Palette::getColour(this_00->palette,2);
  drawParagraphAtCoords(this_00,local_80,&local_68,4.0,pCVar4,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  Vec2d::Vec2d(&local_78,372.0,566.0);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"TETRIS","");
  pCVar4 = Palette::getColour(this_00->palette,0);
  drawParagraphAtCoords(this_00,local_78,&local_68,7.0,pCVar4,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_260);
  std::ios_base::~ios_base(local_1e0);
  return;
}

Assistant:

void UIDisplayer::drawGameplayScreen(World* world) {
    GLfloat blockSize = 30;

    Colour* borderColour = palette->getColour(Palette::WHITE);
    Colour* shapeColour = palette->getColour(Palette::ORANGE);
    Colour* shapeLineColour = palette->getColour(Palette::WHITE);
    
    // field
    primitiveDisplayer->drawRectangleOutline(Vec2d(blockSize, blockSize), Vec2d(10 * blockSize, 20 * blockSize), borderColour);
    
    //grid
    glPushMatrix();
        glColor4f(1.f, 1.f, 1.f, 0.5f);
        glTranslatef(1, 1, 0);
        for (int i = 1; i < 10; i++) {
            glPushMatrix();
                glTranslatef(blockSize, 0, 0);
                glLineWidth((i%5==0) ? 5 : 0.5);
                glBegin(GL_LINES);
                    glVertex2f(i*blockSize, blockSize);
                    glVertex2f(i*blockSize, 21 * blockSize);
                glEnd();
            glPopMatrix();
        }
        for (int i = 1; i < 20; i++) {
            glPushMatrix();
                glTranslatef(0, blockSize, 0);
                glLineWidth((i%5==0) ? 5 : 0.5);
                glBegin(GL_LINES);
                    glVertex2f(blockSize, i*blockSize);
                    glVertex2f(11*blockSize, i* blockSize);
                glEnd();
            glPopMatrix();
        }
    glPopMatrix();
    
    // next shape
    primitiveDisplayer->drawRectangleOutline(Vec2d(12 * blockSize, blockSize), Vec2d(9 * blockSize, 4 * blockSize), borderColour);
    drawParagraphAtCoords(Vec2d(12 * blockSize + 12, blockSize + 14), "NEXT", 4, palette->getColour(Palette::PINK), false);
    
    glPushMatrix();
        Vec2d* newShapePos = new Vec2d(0, 20);
        glTranslatef(17 * blockSize, 4.5 * blockSize, 0.f);
        primitiveDisplayer->drawableWithGLRotation(world->getNextTet(), world->getNextTet()->getType()->getDisplayRotation(), newShapePos);
        delete newShapePos;
        newShapePos = nullptr;
    glPopMatrix();

    
    // score
    primitiveDisplayer->drawRectangleOutline(Vec2d(12 * blockSize, 6 * blockSize), Vec2d(9 * blockSize, 4 * blockSize), borderColour);
    drawParagraphAtCoords(Vec2d(12 * blockSize + 12, 6 * blockSize + 14), "SCORE", 4, palette->getColour(Palette::PINK), false);
    
    stringstream ss;
    ss << setw(6) << setfill('0') << world->getScore();
    drawParagraphAtCoords(Vec2d(12 * blockSize + 12, 7 * blockSize + 26), ss.str(), 7, palette->getColour(Palette::GREEN), true);
    
    // logo
    primitiveDisplayer->drawRectangleOutline(Vec2d(12 * blockSize, 17 * blockSize), Vec2d(9 * blockSize, 4 * blockSize), borderColour);
    drawParagraphAtCoords(Vec2d(12 * blockSize + 88, 17 * blockSize + 14), "LANA", 4, palette->getColour(Palette::PINK), false);
    drawParagraphAtCoords(Vec2d(12 * blockSize + 12, 18 * blockSize + 26), "TETRIS", 7, palette->getColour(Palette::GREEN), true);
    
    borderColour = nullptr;
    shapeColour = nullptr;
    shapeLineColour = nullptr;
}